

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.h
# Opt level: O3

grid * __thiscall
idx2::Relative<idx2::grid,idx2::grid>
          (grid *__return_storage_ptr__,idx2 *this,grid *Grid1,grid *Grid2)

{
  long lVar1;
  long lVar2;
  u64 uVar3;
  u64 uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  lVar1 = *(long *)this;
  lVar2 = *(long *)(this + 0x10);
  uVar3 = (Grid1->super_extent).From;
  uVar4 = Grid1->Strd;
  iVar7 = ((int)uVar4 << 0xb) >> 0xb;
  iVar6 = (int)((long)(uVar4 << 0x16) >> 0x2b);
  iVar8 = (int)((long)(uVar4 * 2) >> 0x2b);
  uVar5 = *(ulong *)(this + 8);
  (__return_storage_ptr__->super_extent).From =
       (ulong)(((int)(lVar1 * 2 >> 0x2b) - (int)((long)(uVar3 * 2) >> 0x2b)) / iVar8 & 0x1fffff) <<
       0x2a | (ulong)((int)(((lVar1 << 0x16) >> 0xb) -
                            ((long)(uVar3 << 0x16) >> 0xb & 0xffffffff00000000U) >> 0x20) / iVar6 &
                     0x1fffff) << 0x15 |
              (ulong)(((((int)lVar1 << 0xb) >> 0xb) - (((int)uVar3 << 0xb) >> 0xb)) / iVar7 &
                     0x1fffff);
  (__return_storage_ptr__->super_extent).Dims = uVar5 & 0x7fffffffffffffff;
  __return_storage_ptr__->Strd =
       (ulong)((uint)((long)((ulong)(uint)(lVar2 * 2 >> 0x3f) << 0x20 |
                            lVar2 * 2 >> 0x2b & 0xffffffffU) / (long)iVar8) & 0x1fffff) << 0x2a |
       (ulong)((int)((lVar2 << 0x16) >> 0x2b) / iVar6 & 0x1fffff) << 0x15 |
       (ulong)((((int)lVar2 << 0xb) >> 0xb) / iVar7 & 0x1fffff);
  return __return_storage_ptr__;
}

Assistant:

idx2_Inline v3i
From(const grid& Grid)
{
  return Unpack3i64(Grid.From);
}